

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O2

MemoryWriter * spdlog::details::pad_n_join(MemoryWriter *w,int v1,int v2,int v3,char sep)

{
  BasicWriter<char> *pBVar1;
  IntFormatSpec<int,_fmt::AlignTypeSpec<__x00_>,_char> spec;
  IntFormatSpec<int,_fmt::AlignTypeSpec<__x00_>,_char> spec_00;
  IntFormatSpec<int,_fmt::AlignTypeSpec<__x00_>,_char> spec_01;
  
  spec._8_8_ = (ulong)(uint)v1 << 0x20;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar1 = fmt::BasicWriter<char>::operator<<(&w->super_BasicWriter<char>,spec);
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,sep);
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.align_ = (int)((ulong)(uint)v2 << 0x20);
  spec_00.value_ = (int)(((ulong)(uint)v2 << 0x20) >> 0x20);
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,spec_00);
  pBVar1 = fmt::BasicWriter<char>::operator<<(pBVar1,sep);
  spec_01.super_AlignTypeSpec<__x00_>.super_AlignSpec.align_ = (int)((ulong)(uint)v3 << 0x20);
  spec_01.value_ = (int)(((ulong)(uint)v3 << 0x20) >> 0x20);
  spec_01.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_01.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::operator<<(pBVar1,spec_01);
  return w;
}

Assistant:

static fmt::MemoryWriter &pad_n_join(fmt::MemoryWriter &w, int v1, int v2, int v3, char sep)
{
    w << fmt::pad(v1, 2, '0') << sep << fmt::pad(v2, 2, '0') << sep << fmt::pad(v3, 2, '0');
    return w;
}